

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O2

Var Js::JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_Internal_ToLengthFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  int64 nValue;
  Var pvVar5;
  uint in_stack_00000010;
  Var in_stack_00000020;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x184,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bd11e1;
    *puVar4 = 0;
  }
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x184,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00bd11e1;
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)callInfo & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x184,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00bd11e1;
    *puVar4 = 0;
  }
  else {
    if ((int)((ulong)callInfo & 0xffffff) == 2) goto LAB_00bd11bc;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  *puVar4 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                              ,0x185,"(args.Info.Count == 2)","args.Info.Count == 2");
  if (!bVar3) {
LAB_00bd11e1:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar4 = 0;
LAB_00bd11bc:
  nValue = JavascriptConversion::ToLength(in_stack_00000020,pSVar1);
  pvVar5 = JavascriptNumber::ToVar(nValue,pSVar1);
  return pvVar5;
}

Assistant:

Var JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_Internal_ToLengthFunction(RecyclableObject * function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        Assert(args.Info.Count == 2);
        return JavascriptNumber::ToVar(JavascriptConversion::ToLength(args.Values[1], scriptContext), scriptContext);
    }